

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

int Kf_ManComputeDelay(Kf_Man_t *p,int fEval)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  word *pwVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  
  pGVar3 = p->pGia;
  if (((fEval != 0) && (iVar7 = pGVar3->nObjs, 0 < iVar7)) &&
     (pGVar4 = pGVar3->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    lVar10 = 0;
    do {
      uVar11 = *(uint *)(pGVar4 + lVar10);
      if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) && (0 < pGVar3->pRefs[lVar10])) {
        if ((p->vCuts).nSize <= lVar10) goto LAB_00767fc6;
        uVar11 = (p->vCuts).pArray[lVar10];
        pwVar5 = (p->pMem).pPages[(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        uVar11 = uVar11 & (p->pMem).uPageMask;
        lVar12 = (long)*(int *)((long)pwVar5 + (long)(int)uVar11 * 8 + 4);
        uVar1 = *(uint *)((long)pwVar5 + lVar12 * 4 + (long)(int)uVar11 * 8);
        if ((int)uVar1 < 1) {
          iVar7 = (p->vTime).nSize;
          iVar8 = 1;
        }
        else {
          iVar8 = 0;
          lVar13 = 1;
          do {
            uVar9 = *(uint *)((long)pwVar5 + lVar13 * 4 + lVar12 * 4 + (long)(int)uVar11 * 8);
            if ((int)uVar9 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar9 = uVar9 >> 1;
            iVar7 = (p->vTime).nSize;
            if (iVar7 <= (int)uVar9) goto LAB_00767fc6;
            iVar2 = (p->vTime).pArray[uVar9];
            if (iVar8 <= iVar2) {
              iVar8 = iVar2;
            }
            lVar13 = lVar13 + 1;
          } while ((ulong)uVar1 + 1 != lVar13);
          iVar8 = iVar8 + 1;
        }
        if (iVar7 <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vTime).pArray[lVar10] = iVar8;
        iVar7 = pGVar3->nObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  lVar10 = (long)pGVar3->vCos->nSize;
  if (lVar10 < 1) {
    iVar7 = 0;
  }
  else {
    lVar12 = 0;
    iVar7 = 0;
    do {
      iVar8 = pGVar3->vCos->pArray[lVar12];
      if (((long)iVar8 < 0) || (pGVar3->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = pGVar3->pObjs;
      pGVar4 = pGVar6 + iVar8 + -(ulong)((uint)*(undefined8 *)(pGVar6 + iVar8) & 0x1fffffff);
      if ((pGVar4 < pGVar6) || (pGVar6 + (uint)pGVar3->nObjs <= pGVar4)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar11 = (int)((long)pGVar4 - (long)pGVar6 >> 2) * -0x55555555;
      if (pGVar3->pRefs[(int)uVar11] < 1) {
        __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                      ,0x385,"int Kf_ManComputeDelay(Kf_Man_t *, int)");
      }
      if (((int)uVar11 < 0) || ((p->vTime).nSize <= (int)uVar11)) {
LAB_00767fc6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = (p->vTime).pArray[uVar11 & 0x7fffffff];
      if (iVar7 <= iVar8) {
        iVar7 = iVar8;
      }
      lVar12 = lVar12 + 1;
    } while (lVar10 != lVar12);
  }
  return iVar7;
}

Assistant:

int Kf_ManComputeDelay( Kf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachAnd( p->pGia, pObj, i )
            if ( Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vTime, i, Kf_CutTime(p, Kf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Kf_ObjTime(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}